

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O0

String * kj::str<long>(String *__return_storage_ptr__,long *params)

{
  long *value;
  CappedArray<char,_26UL> *params_00;
  CappedArray<char,_26UL> local_40;
  long *local_18;
  long *params_local;
  
  local_18 = params;
  params_local = (long *)__return_storage_ptr__;
  value = fwd<long>(params);
  toCharSequence<long>(&local_40,value);
  _::concat<kj::CappedArray<char,26ul>>(__return_storage_ptr__,(_ *)&local_40,params_00);
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}